

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::TestHugeFieldNumbersLite::clear_oneof_field(TestHugeFieldNumbersLite *this)

{
  uint32_t uVar1;
  TestAllTypesLite *this_00;
  ulong uVar2;
  
  uVar1 = (this->field_0)._impl_._oneof_case_[0];
  if ((uVar1 == 0x1ffffc7e) || (uVar1 == 0x1ffffc7d)) {
    google::protobuf::internal::ArenaStringPtr::Destroy
              (&(this->field_0)._impl_.oneof_field_.oneof_string_);
  }
  else if (uVar1 == 0x1ffffc7c) {
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar2 & 1) != 0) {
      uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
    }
    this_00 = *(TestAllTypesLite **)((long)&this->field_0 + 0x98);
    if (uVar2 == 0) {
      if (this_00 != (TestAllTypesLite *)0x0) {
        TestAllTypesLite::~TestAllTypesLite(this_00);
      }
      operator_delete(this_00,0x348);
    }
    else if (this_00 != (TestAllTypesLite *)0x0) {
      TestAllTypesLite::Clear(this_00);
    }
  }
  (this->field_0)._impl_._oneof_case_[0] = 0;
  return;
}

Assistant:

void TestHugeFieldNumbersLite::clear_oneof_field() {
// @@protoc_insertion_point(one_of_clear_start:proto2_unittest.TestHugeFieldNumbersLite)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  switch (oneof_field_case()) {
    case kOneofUint32: {
      // No need to clear
      break;
    }
    case kOneofTestAllTypes: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.oneof_test_all_types_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        if (_impl_.oneof_field_.oneof_test_all_types_ != nullptr) {
          _impl_.oneof_field_.oneof_test_all_types_->Clear();
        }
      }
      break;
    }
    case kOneofString: {
      _impl_.oneof_field_.oneof_string_.Destroy();
      break;
    }
    case kOneofBytes: {
      _impl_.oneof_field_.oneof_bytes_.Destroy();
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  _impl_._oneof_case_[0] = ONEOF_FIELD_NOT_SET;
}